

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O1

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
          (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
          *other)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  ulong nbCols;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  double dVar8;
  long lVar9;
  undefined8 *puVar10;
  Index index;
  ulong uVar11;
  undefined8 uVar12;
  long lVar13;
  bool bVar14;
  
  uVar11 = *(ulong *)(*(long *)(other + 8) + 8);
  nbCols = *(ulong *)(*(long *)(other + 8) + 0x10);
  bVar14 = nbCols == 0 || uVar11 == 0;
  if ((bVar14) ||
     (auVar7 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     uVar12 = SUB168(auVar7 % SEXT816((long)nbCols),0),
     (long)uVar11 <= SUB168(auVar7 / SEXT816((long)nbCols),0))) {
    if ((long)(nbCols | uVar11) < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/PlainObjectBase.h"
                    ,0xf1,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if ((bVar14) ||
       (auVar7 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       uVar12 = SUB168(auVar7 % SEXT816((long)nbCols),0),
       (long)uVar11 <= SUB168(auVar7 / SEXT816((long)nbCols),0))) {
      DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)this,nbCols * uVar11,uVar11,nbCols);
      if ((*(long *)(this + 8) == *(long *)(*(long *)(other + 8) + 8)) &&
         (*(long *)(this + 0x10) == *(long *)(*(long *)(other + 8) + 0x10))) {
        lVar9 = *(long *)(this + 0x10) * *(long *)(this + 8);
        uVar11 = lVar9 - (lVar9 >> 0x3f) & 0xfffffffffffffffe;
        if (1 < lVar9) {
          lVar13 = 0;
          do {
            pdVar1 = (double *)(**(long **)other + lVar13 * 8);
            dVar8 = pdVar1[1];
            pdVar2 = (double *)(**(long **)(other + 8) + lVar13 * 8);
            dVar4 = pdVar2[1];
            pdVar3 = (double *)(*(long *)this + lVar13 * 8);
            *pdVar3 = *pdVar1 + *pdVar2;
            pdVar3[1] = dVar8 + dVar4;
            lVar13 = lVar13 + 2;
          } while (lVar13 < (long)uVar11);
        }
        if ((long)uVar11 < lVar9) {
          lVar13 = **(long **)other;
          lVar5 = **(long **)(other + 8);
          lVar6 = *(long *)this;
          do {
            *(double *)(lVar6 + uVar11 * 8) =
                 *(double *)(lVar13 + uVar11 * 8) + *(double *)(lVar5 + uVar11 * 8);
            uVar11 = uVar11 + 1;
          } while (lVar9 - uVar11 != 0);
        }
        return (Matrix<double,__1,__1,_0,__1,__1> *)this;
      }
      __assert_fail("rows() == other.rows() && cols() == other.cols()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/Assign.h"
                    ,0x1f9,
                    "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, -1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, -1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Matrix<double, -1, -1>>]"
                   );
    }
  }
  puVar10 = (undefined8 *)__cxa_allocate_exception(8,bVar14,uVar12);
  *puVar10 = operator_delete;
  __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

EIGEN_STRONG_INLINE Derived& lazyAssign(const DenseBase<OtherDerived>& other)
    {
      _resize_to_match(other);
      return Base::lazyAssign(other.derived());
    }